

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

Page * page_merge_hot(Page *pA,Page *pB)

{
  Page *pPVar1;
  Page local_68;
  
  local_68.pPrevHot = (Page *)0x0;
  pPVar1 = &local_68;
  while ((pA != (Page *)0x0 && (pB != (Page *)0x0))) {
    if (pA->pgno < pB->pgno) {
      pPVar1->pPrevHot = pA;
      pA->pNextHot = pPVar1;
      pPVar1 = pA;
      pA = pA->pPrevHot;
    }
    else {
      pPVar1->pPrevHot = pB;
      pB->pNextHot = pPVar1;
      pPVar1 = pB;
      pB = pB->pPrevHot;
    }
  }
  if (pA == (Page *)0x0) {
    if (pB == (Page *)0x0) {
      pPVar1->pNextHot = (Page *)0x0;
      pPVar1->pPrevHot = (Page *)0x0;
    }
    else {
      pPVar1->pPrevHot = pB;
      pB->pNextHot = pPVar1;
    }
  }
  else {
    pPVar1->pPrevHot = pA;
    pA->pNextHot = pPVar1;
  }
  return local_68.pPrevHot;
}

Assistant:

static Page * page_merge_hot(Page *pA, Page *pB)
{
	Page result, *pTail;
    /* Prevent compiler warning */
	result.pNextHot = result.pPrevHot = 0;
	pTail = &result;
	while( pA && pB ){
		if( pA->pgno < pB->pgno ){
			pTail->pPrevHot = pA;
			pA->pNextHot = pTail;
			pTail = pA;
			pA = pA->pPrevHot;
		}else{
			pTail->pPrevHot = pB;
			pB->pNextHot = pTail;
			pTail = pB;
			pB = pB->pPrevHot;
		}
	}
	if( pA ){
		pTail->pPrevHot = pA;
		pA->pNextHot = pTail;
	}else if( pB ){
		pTail->pPrevHot = pB;
		pB->pNextHot = pTail;
	}else{
		pTail->pPrevHot = pTail->pNextHot = 0;
	}
	return result.pPrevHot;
}